

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O1

Llb_Mtr_t * Llb_MtrCreate(Llb_Man_t *p)

{
  Llb_Mtr_t *p_00;
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  p_00 = Llb_MtrAlloc(p->pAig->nTruePis,p->pAig->nRegs,p->vGroups->nSize,p->vVar2Obj->nSize);
  pVVar1 = p->vGroups;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      Llb_MtrAddColumn(p_00,(Llb_Grp_t *)pVVar1->pArray[lVar2]);
      lVar2 = lVar2 + 1;
      pVVar1 = p->vGroups;
    } while (lVar2 < pVVar1->nSize);
  }
  return p_00;
}

Assistant:

Llb_Mtr_t * Llb_MtrCreate( Llb_Man_t * p )
{
    Llb_Mtr_t * pMatrix;
    Llb_Grp_t * pGroup;
    int i;
    pMatrix = Llb_MtrAlloc( Saig_ManPiNum(p->pAig), Saig_ManRegNum(p->pAig), 
        Vec_PtrSize(p->vGroups), Vec_IntSize(p->vVar2Obj) );
    Vec_PtrForEachEntry( Llb_Grp_t *, p->vGroups, pGroup, i )
        Llb_MtrAddColumn( pMatrix, pGroup );
//    Llb_MtrRemoveSingletonRows( pMatrix );
    return pMatrix;
}